

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

void linfren(lindef *lin,objnum oldnum,objnum newnum)

{
  ushort *puVar1;
  ushort uVar2;
  uchar *puVar3;
  long lVar4;
  uint16_t tmp;
  int iVar5;
  _func_void_lindef_ptr_objnum_objnum **pp_Var6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  iVar8 = *(int *)&lin[2].linbuf;
  if (iVar8 != 0) {
    iVar5 = (iVar8 + -1 >> 10) + 1;
    pp_Var6 = &lin[1].linrenp;
    while( true ) {
      iVar7 = 0x400;
      if (iVar8 < 0x400) {
        iVar7 = iVar8;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      bVar9 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      if (bVar9) break;
      puVar3 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var6);
      for (lVar4 = 0; iVar7 != (int)lVar4; lVar4 = lVar4 + 1) {
        if (*(objnum *)(puVar3 + lVar4 * 4) == oldnum) {
          *(objnum *)(puVar3 + lVar4 * 4) = newnum;
        }
      }
      uVar2 = *(ushort *)
               (*(long *)(lin[1].linofsp + (ulong)(*(ushort *)pp_Var6 >> 8) * 8 + 0x30) +
               (ulong)(*(ushort *)pp_Var6 & 0xff) * 2);
      puVar1 = (ushort *)
               (*(long *)(**(long **)lin[1].linofsp + (ulong)(uVar2 >> 8) * 8) + 0x14 +
               (ulong)((uVar2 & 0xff) << 5));
      *puVar1 = *puVar1 | 1;
      mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)pp_Var6);
      pp_Var6 = (_func_void_lindef_ptr_objnum_objnum **)((long)pp_Var6 + 2);
      iVar8 = iVar8 + -0x400;
    }
  }
  return;
}

Assistant:

void linfren(lindef *lin, objnum oldnum, objnum newnum)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            /* check this one */
            if (osrp2(objp) == oldnum)
            {
                /* it matches - renumber it */
                oswp2(objp, newnum);
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}